

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glBindFramebuffer(QOpenGLFunctions *this,GLenum target,GLuint framebuffer)

{
  GLuint in_EDX;
  undefined4 in_ESI;
  QOpenGLContext *in_RDI;
  undefined4 local_10;
  QOpenGLContext *this_00;
  
  local_10 = in_EDX;
  if (in_EDX == 0) {
    this_00 = in_RDI;
    QOpenGLContext::currentContext();
    local_10 = QOpenGLContext::defaultFramebufferObject(this_00);
  }
  (**(code **)(*(long *)in_RDI + 0x198))(in_ESI,local_10);
  return;
}

Assistant:

inline void QOpenGLFunctions::glBindFramebuffer(GLenum target, GLuint framebuffer)
{
    if (framebuffer == 0)
        framebuffer = QOpenGLContext::currentContext()->defaultFramebufferObject();
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glBindFramebuffer(target, framebuffer);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.BindFramebuffer(target, framebuffer);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}